

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::RepeatedField<bool>::~RepeatedField(RepeatedField<bool> *this)

{
  Rep *pRVar1;
  
  pRVar1 = this->rep_;
  if ((pRVar1 != (Rep *)0x0) && (pRVar1->arena == (Arena *)0x0)) {
    operator_delete(pRVar1,(long)this->total_size_ + 8);
    return;
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
  // See explanation in Reserve(): we need to invoke destructors here for the
  // case that Element has a non-trivial destructor.
  InternalDeallocate(rep_, total_size_);
}